

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

size_t __thiscall opengv::math::Sturm::evaluateChain2(Sturm *this,double bound)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  Scalar *pSVar4;
  size_t sVar5;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t i_2;
  int signChanges;
  bool positive;
  size_t j;
  size_t i_1;
  vector<double,_std::allocator<double>_> signs;
  size_t i;
  vector<double,_std::allocator<double>_> monomials;
  value_type_conflict1 *in_stack_ffffffffffffff38;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  pointer local_80;
  int local_78;
  pointer local_70;
  pointer local_60;
  vector<double,_std::allocator<double>_> local_58;
  pointer local_40;
  vector<double,_std::allocator<double>_> local_28;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x128a307);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&local_28,
                      (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - 1);
  *pvVar3 = 1.0;
  for (local_40 = (pointer)0x2;
      local_40 <=
      in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; local_40 = (pointer)((long)local_40 + 1)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_28,
                        (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish + (1 - (long)local_40));
    in_stack_ffffffffffffff68 = *pvVar3 * local_10;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_28,
                        (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)local_40);
    *pvVar3 = in_stack_ffffffffffffff68;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x128a406);
  std::vector<double,_std::allocator<double>_>::reserve(in_RDI,(size_type)in_stack_ffffffffffffff68)
  ;
  for (local_60 = (pointer)0x0;
      local_60 <
      in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; local_60 = (pointer)((long)local_60 + 1)) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    for (local_70 = local_60;
        local_70 <
        in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish; local_70 = (pointer)((long)local_70 + 1)) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38,0x128a488);
      in_stack_ffffffffffffff50 = (vector<double,_std::allocator<double>_> *)*pSVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_28,(size_type)local_70);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::back
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = vVar1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = in_stack_ffffffffffffff50;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *pvVar3;
      auVar6 = vfmadd213sd_fma(auVar6,auVar7,auVar8);
      *pvVar3 = auVar6._0_8_;
    }
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
  bVar2 = 0.0 < *pvVar3;
  local_78 = 0;
  for (local_80 = (pointer)0x1;
      local_80 <
      in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish; local_80 = (pointer)((long)local_80 + 1)) {
    if (bVar2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_58,(size_type)local_80);
      if (*pvVar3 < 0.0) {
        local_78 = local_78 + 1;
        bVar2 = false;
      }
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_58,(size_type)local_80);
      if (0.0 < *pvVar3) {
        local_78 = local_78 + 1;
        bVar2 = true;
      }
    }
  }
  sVar5 = (size_t)local_78;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
  return sVar5;
}

Assistant:

size_t
opengv::math::Sturm::evaluateChain2( double bound )
{  
  std::vector<double> monomials;
  monomials.resize(_dimension);
  monomials[_dimension-1] = 1.0;
  
  //evaluate all monomials at the bound
  for(size_t i = 2; i <= _dimension; i++)
    monomials[_dimension-i] = monomials[_dimension-i+1]*bound;
  
  std::vector<double> signs;
  signs.reserve(_dimension);
  for( size_t i = 0; i < _dimension; i++ )
  {
    signs.push_back(0.0);
    for( size_t j = i; j < _dimension; j++ )
      signs.back() += _C(i,j) * monomials[j];
  }
  
  bool positive = false;
  if( signs[0] > 0.0 )
    positive = true;
  
  int signChanges = 0;
  
  for( size_t i = 1; i < _dimension; i++ )
  {
    if( positive )
    {
      if( signs[i] < 0.0 )
      {
        signChanges++;
        positive = false;
      }
    }
    else
    {
      if( signs[i] > 0.0 )
      {
        signChanges++;
        positive = true;
      }
    }
  }
  
  return signChanges;
}